

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O0

LocalFederateId __thiscall
helics::EmptyCore::registerFederate(EmptyCore *this,string_view param_2,CoreFederateInfo *param_3)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  RegistrationFailure *in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  uVar1 = __cxa_allocate_exception(0x28);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (allocator<char> *)in_stack_ffffffffffffffc0);
  std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  RegistrationFailure::RegistrationFailure(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
  __cxa_throw(uVar1,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

LocalFederateId EmptyCore::registerFederate(std::string_view /*name*/,
                                            const CoreFederateInfo& /*info*/)
{
    throw(RegistrationFailure(std::string("Registration is not possible for Null Core")));
}